

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

void * __thiscall
Fossilize::StateRecorder::Impl::copy_pnext_struct
          (Impl *this,VkPipelineColorWriteCreateInfoEXT *create_info,ScratchAllocator *alloc,
          DynamicStateInfo *dynamic_state_info)

{
  void *pvVar1;
  undefined8 uVar2;
  VkBool32 *pVVar3;
  undefined8 *puVar4;
  void *__dest;
  size_t size;
  
  puVar4 = (undefined8 *)ScratchAllocator::allocate_raw(alloc,0x20,0x10);
  if (puVar4 != (undefined8 *)0x0) {
    uVar2 = *(undefined8 *)create_info;
    pvVar1 = create_info->pNext;
    pVVar3 = create_info->pColorWriteEnables;
    puVar4[2] = *(undefined8 *)&create_info->attachmentCount;
    puVar4[3] = pVVar3;
    *puVar4 = uVar2;
    puVar4[1] = pvVar1;
  }
  if ((dynamic_state_info == (DynamicStateInfo *)0x0) ||
     (dynamic_state_info->color_write_enable != false)) {
    puVar4[3] = 0;
    return puVar4;
  }
  if ((ulong)*(uint *)(puVar4 + 2) != 0) {
    pvVar1 = (void *)puVar4[3];
    size = (ulong)*(uint *)(puVar4 + 2) << 2;
    __dest = ScratchAllocator::allocate_raw(alloc,size,0x10);
    if (__dest != (void *)0x0) {
      memmove(__dest,pvVar1,size);
      goto LAB_0014ff25;
    }
  }
  __dest = (void *)0x0;
LAB_0014ff25:
  puVar4[3] = __dest;
  return puVar4;
}

Assistant:

void *StateRecorder::Impl::copy_pnext_struct(const VkPipelineColorWriteCreateInfoEXT *create_info,
                                             ScratchAllocator &alloc,
                                             const DynamicStateInfo *dynamic_state_info)
{
	auto *color_write = copy(create_info, 1, alloc);
	if (dynamic_state_info && !dynamic_state_info->color_write_enable)
		color_write->pColorWriteEnables = copy(color_write->pColorWriteEnables, color_write->attachmentCount, alloc);
	else
		color_write->pColorWriteEnables = nullptr;
	return color_write;
}